

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall mjs::parser::~parser(parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if (this->expression_pos_ != (position_stack_node *)0x0) {
    __assert_fail("!expression_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0xf2,"mjs::parser::~parser()");
  }
  if (this->statement_pos_ == (position_stack_node *)0x0) {
    token::destroy(&this->current_token_);
    token::destroy(&(this->lexer_).current_token_);
    this_00 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
    return;
  }
  __assert_fail("!statement_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0xf3,"mjs::parser::~parser()");
}

Assistant:

~parser() {
        assert(!expression_pos_);
        assert(!statement_pos_);
    }